

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_int<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<char,fmt::v6::basic_format_specs<char>>::dec_writer>
          (basic_writer<fmt::v6::buffer_range<char>> *this,int num_digits,string_view prefix,
          format_specs specs,dec_writer f)

{
  ulong uVar1;
  ulong uVar2;
  format_specs local_48;
  padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>_>::int_writer<char,_fmt::v6::basic_format_specs<char>_>::dec_writer>
  local_38;
  
  local_38.prefix.size_ = prefix.size_;
  local_38.prefix.data_ = prefix.data_;
  uVar2 = (uint)num_digits + local_38.prefix.size_;
  local_48._9_1_ = specs._9_1_;
  local_48.fill.data_[0] = specs.fill.data_[0];
  local_38.size_ = uVar2;
  local_38.fill = local_48.fill.data_[0];
  if ((local_48._9_1_ & 0xf) == 4) {
    uVar1 = specs._0_8_ & 0xffffffff;
    local_38.padding = 0;
    if (uVar2 <= uVar1) {
      local_38.size_ = uVar1;
      local_38.padding = uVar1 - uVar2;
    }
  }
  else {
    local_48.precision = specs.precision;
    if (num_digits < local_48.precision) {
      local_38.size_ = (uint)local_48.precision + local_38.prefix.size_;
      local_38.padding = (ulong)(uint)(local_48.precision - num_digits);
      local_38.fill = '0';
    }
    else {
      local_38.padding = 0;
    }
  }
  local_48._8_8_ = specs._8_8_;
  if (((undefined1  [16])specs & (undefined1  [16])0xf00) == (undefined1  [16])0x0) {
    local_48._8_8_ = specs._8_8_ | 0x200;
  }
  local_38.f = f;
  local_48._0_8_ = specs._0_8_;
  write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::int_writer<char,fmt::v6::basic_format_specs<char>>::dec_writer>>
            (this,&local_48,&local_38);
  return;
}

Assistant:

void write_int(int num_digits, string_view prefix, format_specs specs, F f) {
    std::size_t size = prefix.size() + to_unsigned(num_digits);
    char_type fill = specs.fill[0];
    std::size_t padding = 0;
    if (specs.align == align::numeric) {
      auto unsiged_width = to_unsigned(specs.width);
      if (unsiged_width > size) {
        padding = unsiged_width - size;
        size = unsiged_width;
      }
    } else if (specs.precision > num_digits) {
      size = prefix.size() + to_unsigned(specs.precision);
      padding = to_unsigned(specs.precision - num_digits);
      fill = static_cast<char_type>('0');
    }
    if (specs.align == align::none) specs.align = align::right;
    write_padded(specs, padded_int_writer<F>{size, prefix, fill, padding, f});
  }